

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O1

void __thiscall
Clasp::DefaultUnfoundedCheck::RemoveSource::operator()(RemoveSource *this,NodeId bodyId,uint32 idx)

{
  uint uVar1;
  DefaultUnfoundedCheck *this_00;
  pointer pBVar2;
  ExtData *pEVar3;
  NodeId NVar4;
  BodyPtr local_10;
  
  this_00 = this->self;
  local_10.node = (this_00->graph_->bodies_).ebo_.buf + bodyId;
  pBVar2 = (this_00->bodies_).ebo_.buf;
  pEVar3 = (this_00->extended_).ebo_.buf[pBVar2[bodyId].lower_or_ext];
  NVar4 = 1;
  if ((((local_10.node)->super_Node).field_0x7 & 0x20) != 0) {
    NVar4 = ((local_10.node)->super_Node).sep_[(ulong)(idx * 2) + 1];
  }
  uVar1 = (&pEVar3[1].lower)[idx >> 5];
  if ((uVar1 >> (idx & 0x1f) & 1) != 0) {
    pEVar3->lower = pEVar3->lower + NVar4;
    (&pEVar3[1].lower)[idx >> 5] = uVar1 & ~(1 << ((byte)idx & 0x1f));
  }
  if ((0 < pEVar3->lower) && (((ulong)pBVar2[bodyId] & 0x7fffffff) != 0)) {
    local_10.id = bodyId;
    forwardUnsource(this_00,&local_10,true);
  }
  return;
}

Assistant:

void DefaultUnfoundedCheck::RemoveSource::operator()(NodeId bodyId, uint32 idx) const {
	BodyPtr n(self->getBody(bodyId));
	ExtData* ext = self->extended_[self->bodies_[bodyId].lower_or_ext];
	ext->removeFromWs(idx, n.node->pred_weight(idx, false));
	if (ext->lower > 0 && self->bodies_[n.id].watches > 0) {
		// extended bodies don't always become false if a predecessor becomes false
		// eagerly enqueue all successors watching this body
		self->forwardUnsource(n, true);
	}
}